

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O1

String * __thiscall CommandLine::describeOptions(String *__return_storage_ptr__,CommandLine *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator *piVar2;
  CommandLineOption *pCVar3;
  pointer pcVar4;
  String *pSVar5;
  int iVar6;
  _Elt_pointer ppCVar7;
  int iVar8;
  ulong uVar9;
  _Elt_pointer pSVar10;
  ulong uVar11;
  int iVar12;
  _Map_pointer ppSVar13;
  String *line_1;
  _Elt_pointer pSVar14;
  _Elt_pointer ppCVar15;
  _Elt_pointer ppCVar16;
  _Map_pointer pppCVar17;
  String line;
  StringList lines;
  StringList extralines;
  String description;
  String *result;
  value_type local_1b0;
  CommandLine *local_190;
  _Deque_base<String,_std::allocator<String>_> local_188;
  _Deque_base<String,_std::allocator<String>_> local_138;
  String local_e8;
  _Map_pointer local_c8;
  String *local_c0;
  _Elt_pointer local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  String local_70;
  String local_50;
  
  local_188._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_c0 = __return_storage_ptr__;
  std::_Deque_base<String,_std::allocator<String>_>::_M_initialize_map(&local_188,0);
  ppCVar7 = (this->_options)._deque.
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_b8 = (this->_options)._deque.
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  local_190 = this;
  if (ppCVar7 != local_b8) {
    ppCVar15 = (this->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
    local_c8 = (this->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    piVar2 = &local_138._M_impl.super__Deque_impl_data._M_start;
    do {
      pCVar3 = *ppCVar7;
      local_1b0._string._M_dataplus._M_p = (pointer)&local_1b0._string.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"  ","");
      pSVar10 = local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (pCVar3->_shortform == '\0') {
        std::__cxx11::string::append((char *)&local_1b0);
      }
      else {
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = SUB84(pSVar10,4);
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_ =
             (uint)CONCAT11(pCVar3->_shortform,0x2d);
        local_138._M_impl.super__Deque_impl_data._M_map_size = 3;
        local_90[0] = local_80;
        local_138._M_impl.super__Deque_impl_data._M_map = &piVar2->_M_cur;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,piVar2,
                   (undefined1 *)
                   ((long)&local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 3));
        std::__cxx11::string::append((char *)&local_1b0);
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        if ((iterator *)local_138._M_impl.super__Deque_impl_data._M_map != piVar2) {
          operator_delete(local_138._M_impl.super__Deque_impl_data._M_map);
        }
      }
      std::__cxx11::string::append((char *)&local_1b0);
      if (*(pCVar3->_longform)._string._M_dataplus._M_p != '\0') {
        local_138._M_impl.super__Deque_impl_data._M_map = &piVar2->_M_cur;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"--","");
        String::operator+(&local_50,(String *)&local_138,&pCVar3->_longform);
        if ((iterator *)local_138._M_impl.super__Deque_impl_data._M_map != piVar2) {
          operator_delete(local_138._M_impl.super__Deque_impl_data._M_map);
        }
        std::__cxx11::string::append((char *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._string._M_dataplus._M_p != &local_50._string.field_2) {
          operator_delete(local_50._string._M_dataplus._M_p);
        }
        (*pCVar3->_vptr_CommandLineOption[3])(&local_e8,pCVar3);
        if (*local_e8._string._M_dataplus._M_p != '\0') {
          local_138._M_impl.super__Deque_impl_data._M_map = &piVar2->_M_cur;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"=","");
          String::operator+(&local_70,(String *)&local_138,&local_e8);
          if ((iterator *)local_138._M_impl.super__Deque_impl_data._M_map != piVar2) {
            operator_delete(local_138._M_impl.super__Deque_impl_data._M_map);
          }
          std::__cxx11::string::append((char *)&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._string._M_dataplus._M_p != &local_70._string.field_2) {
            operator_delete(local_70._string._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._string._M_dataplus._M_p != &local_e8._string.field_2) {
          operator_delete(local_e8._string._M_dataplus._M_p);
        }
      }
      std::deque<String,_std::allocator<String>_>::push_back
                ((deque<String,_std::allocator<String>_> *)&local_188,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._string._M_dataplus._M_p != &local_1b0._string.field_2) {
        operator_delete(local_1b0._string._M_dataplus._M_p);
      }
      ppCVar7 = ppCVar7 + 1;
      if (ppCVar7 == ppCVar15) {
        ppCVar7 = local_c8[1];
        local_c8 = local_c8 + 1;
        ppCVar15 = ppCVar7 + 0x40;
      }
    } while (ppCVar7 != local_b8);
  }
  if (local_188._M_impl.super__Deque_impl_data._M_start._M_cur ==
      local_188._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    iVar12 = 2;
  }
  else {
    iVar12 = 0;
    ppSVar13 = local_188._M_impl.super__Deque_impl_data._M_start._M_node;
    pSVar14 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur;
    pSVar10 = local_188._M_impl.super__Deque_impl_data._M_start._M_last;
    do {
      iVar6 = (int)(pSVar14->_string)._M_string_length;
      if (iVar6 < iVar12) {
        iVar6 = iVar12;
      }
      iVar12 = iVar6;
      pSVar14 = pSVar14 + 1;
      if (pSVar14 == pSVar10) {
        pSVar14 = ppSVar13[1];
        ppSVar13 = ppSVar13 + 1;
        pSVar10 = pSVar14 + 0x10;
      }
    } while (pSVar14 != local_188._M_impl.super__Deque_impl_data._M_finish._M_cur);
    iVar12 = iVar12 + 2;
  }
  iVar6 = (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
          (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
          ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
          0x10;
  pppCVar17 = (local_190->_options)._deque.
              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
  iVar8 = (int)((ulong)((long)(local_190->_options)._deque.
                              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)(local_190->_options)._deque.
                             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
          (int)((ulong)((long)(local_190->_options)._deque.
                              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)(local_190->_options)._deque.
                             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)pppCVar17 -
                   *(int *)&(local_190->_options)._deque.
                            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (uint)(pppCVar17 == (_Map_pointer)0x0)) * 0x40;
  if (iVar6 != iVar8) {
    local_138._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)CONCAT44(local_138._M_impl.super__Deque_impl_data._M_map._4_4_,iVar6);
    local_1b0._string._M_dataplus._M_p._0_4_ = iVar8;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:176: lines.size() (%1) does not equal _options.size() (%2)"
                   ,(int *)&local_138,(int *)&local_1b0);
  }
  for (iVar6 = 0;
      iVar6 < (int)((int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                                 (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >>
                         5) + (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish
                                                  ._M_cur -
                                           (long)local_188._M_impl.super__Deque_impl_data._M_finish.
                                                 _M_first) >> 5) +
                   ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                            (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                    1) + (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node ==
                               (_Map_pointer)0x0)) * 0x10); iVar6 = iVar6 + 1) {
    while( true ) {
      iVar8 = (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
              (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5)
              + ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                + (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node ==
                        (_Map_pointer)0x0)) * 0x10;
      local_138._M_impl.super__Deque_impl_data._M_map._0_4_ = iVar6;
      if (iVar8 <= iVar6) {
        local_1b0._string._M_dataplus._M_p._0_4_ = iVar8;
        error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                       ,(int *)&local_138,(int *)&local_1b0);
      }
      uVar9 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 5) +
              (long)(int)local_138._M_impl.super__Deque_impl_data._M_map;
      if (uVar9 < 0x10) {
        pSVar10 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur +
                  (int)local_138._M_impl.super__Deque_impl_data._M_map;
      }
      else {
        uVar11 = uVar9 >> 4 | 0xf000000000000000;
        if (0 < (long)uVar9) {
          uVar11 = uVar9 >> 4;
        }
        pSVar10 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
                  uVar9 + uVar11 * -0x10;
      }
      if (iVar12 <= (int)(pSVar10->_string)._M_string_length) break;
      local_138._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)CONCAT44(local_138._M_impl.super__Deque_impl_data._M_map._4_4_,iVar6);
      iVar8 = (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
              (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5)
              + ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                + (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node ==
                        (_Map_pointer)0x0)) * 0x10;
      if (iVar8 <= iVar6) {
        local_1b0._string._M_dataplus._M_p._0_4_ = iVar8;
        error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                       ,(int *)&local_138,(int *)&local_1b0);
      }
      uVar9 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 5) +
              (long)(int)local_138._M_impl.super__Deque_impl_data._M_map;
      if (uVar9 < 0x10) {
        pSVar10 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur +
                  (int)local_138._M_impl.super__Deque_impl_data._M_map;
      }
      else {
        uVar11 = uVar9 >> 4 | 0xf000000000000000;
        if (0 < (long)uVar9) {
          uVar11 = uVar9 >> 4;
        }
        pSVar10 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
                  uVar9 + uVar11 * -0x10;
      }
      std::__cxx11::string::append((char *)pSVar10);
    }
    pppCVar17 = (local_190->_options)._deque.
                super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl
                .super__Deque_impl_data._M_finish._M_node;
    iVar8 = (int)((ulong)((long)(local_190->_options)._deque.
                                super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(local_190->_options)._deque.
                               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
            (int)((ulong)((long)(local_190->_options)._deque.
                                super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(local_190->_options)._deque.
                               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
            ((((uint)((int)pppCVar17 -
                     *(int *)&(local_190->_options)._deque.
                              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (uint)(pppCVar17 == (_Map_pointer)0x0)) * 0x40;
    local_138._M_impl.super__Deque_impl_data._M_map._0_4_ = iVar6;
    if (iVar8 <= iVar6) {
      local_1b0._string._M_dataplus._M_p._0_4_ = iVar8;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:264: n (%1) is not less than size() (%2)"
                     ,(int *)&local_138,(int *)&local_1b0);
    }
    ppCVar7 = (local_190->_options)._deque.
              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    uVar9 = ((long)ppCVar7 -
             (long)(local_190->_options)._deque.
                   super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 3) +
            (long)(int)local_138._M_impl.super__Deque_impl_data._M_map;
    if (uVar9 < 0x40) {
      ppCVar7 = ppCVar7 + (int)local_138._M_impl.super__Deque_impl_data._M_map;
    }
    else {
      uVar11 = (uVar9 >> 6) + 0xfc00000000000000;
      if (0 < (long)uVar9) {
        uVar11 = uVar9 >> 6;
      }
      ppCVar7 = (local_190->_options)._deque.
                super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_node[uVar11] + uVar9 + uVar11 * -0x40;
    }
    local_b0[0] = local_a0;
    pcVar4 = ((*ppCVar7)->_description)._string._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar4,
               pcVar4 + ((*ppCVar7)->_description)._string._M_string_length);
    local_138._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)CONCAT44(local_138._M_impl.super__Deque_impl_data._M_map._4_4_,iVar6);
    iVar8 = (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
            (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
            ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
            * 0x10;
    if (iVar8 <= iVar6) {
      local_1b0._string._M_dataplus._M_p._0_4_ = iVar8;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                     ,(int *)&local_138,(int *)&local_1b0);
    }
    uVar9 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 5) +
            (long)(int)local_138._M_impl.super__Deque_impl_data._M_map;
    if (uVar9 < 0x10) {
      pSVar10 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur +
                (int)local_138._M_impl.super__Deque_impl_data._M_map;
    }
    else {
      uVar11 = uVar9 >> 4 | 0xf000000000000000;
      if (0 < (long)uVar9) {
        uVar11 = uVar9 >> 4;
      }
      pSVar10 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
                uVar9 + uVar11 * -0x10;
    }
    std::__cxx11::string::append((char *)pSVar10);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
  }
  local_138._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<String,_std::allocator<String>_>::_M_initialize_map(&local_138,0);
  ppCVar7 = (local_190->_options)._deque.
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppCVar15 = (local_190->_options)._deque.
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  if (ppCVar7 != ppCVar15) {
    ppCVar16 = (local_190->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
    pppCVar17 = (local_190->_options)._deque.
                super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppCVar7)->_vptr_CommandLineOption[4])(&local_1b0);
      if (*local_1b0._string._M_dataplus._M_p != '\0') {
        if ((int)((ulong)((long)local_138._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)local_138._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
            (int)((ulong)((long)local_138._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)local_138._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
            ((((uint)((int)local_138._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (int)local_138._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (uint)(local_138._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
            * 0x10 == 0) {
          local_e8._string._M_dataplus._M_p = (pointer)&local_e8._string.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
          std::deque<String,_std::allocator<String>_>::push_back
                    ((deque<String,_std::allocator<String>_> *)&local_138,(value_type *)&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._string._M_dataplus._M_p != &local_e8._string.field_2) {
            operator_delete(local_e8._string._M_dataplus._M_p);
          }
        }
        std::deque<String,_std::allocator<String>_>::push_back
                  ((deque<String,_std::allocator<String>_> *)&local_138,&local_1b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._string._M_dataplus._M_p != &local_1b0._string.field_2) {
        operator_delete(local_1b0._string._M_dataplus._M_p);
      }
      ppCVar7 = ppCVar7 + 1;
      if (ppCVar7 == ppCVar16) {
        ppCVar7 = pppCVar17[1];
        pppCVar17 = pppCVar17 + 1;
        ppCVar16 = ppCVar7 + 0x40;
      }
    } while (ppCVar7 != ppCVar15);
  }
  List<String>::merge((List<String> *)&local_188,(List<String> *)&local_138);
  paVar1 = &local_1b0._string.field_2;
  local_1b0._string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"\n","");
  pSVar5 = local_c0;
  StringList::join(local_c0,(StringList *)&local_188,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._string._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._string._M_dataplus._M_p);
  }
  std::deque<String,_std::allocator<String>_>::~deque
            ((deque<String,_std::allocator<String>_> *)&local_138);
  std::deque<String,_std::allocator<String>_>::~deque
            ((deque<String,_std::allocator<String>_> *)&local_188);
  return pSVar5;
}

Assistant:

String CommandLine::describeOptions() const
{
	StringList lines;

	for (CommandLineOption* option : _options)
	{
		String line ("  ");

		if (option->shortform() != '\0')
			line += String ({'-', option->shortform(), '\0'});
		else
			line += "  ";

		line += "  ";

		if (not option->longform().isEmpty())
		{
			line += "--" + option->longform();
			String description (option->describeArgument());

			if (not description.isEmpty())
				line += "=" + description;
		}

		lines << line;
	}

	int maxlength (0);

	for (String& line : lines)
		maxlength = max (maxlength, line.length());

	maxlength += 2;
	ASSERT_EQ (lines.size(), _options.size());

	for (int i = 0; i < lines.size(); ++i)
	{
		while (lines[i].length() < maxlength)
			lines[i] += " ";

		lines[i] += _options[i]->description();
	}

	StringList extralines;

	for (CommandLineOption* option : _options)
	{
		String extradata = option->describeExtra();

		if (not extradata.isEmpty())
		{
			if (extralines.isEmpty())
				extralines << "";

			extralines << extradata;
		}
	}

	lines.merge (extralines);
	String result (lines.join ("\n"));
	return result;
}